

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O1

Gia_IsoMan_t * Gia_IsoManStart(Gia_Man_t *pGia)

{
  Gia_IsoMan_t *pGVar1;
  int *piVar2;
  word *pwVar3;
  Vec_Int_t *pVVar4;
  int iVar5;
  int iVar6;
  size_t __nmemb;
  
  pGVar1 = (Gia_IsoMan_t *)calloc(1,0x80);
  pGVar1->pGia = pGia;
  iVar5 = pGia->nObjs;
  __nmemb = (size_t)iVar5;
  pGVar1->nObjs = iVar5;
  pGVar1->nUniques = 1;
  pGVar1->nEntries = iVar5;
  piVar2 = (int *)calloc(__nmemb,4);
  pGVar1->pLevels = piVar2;
  piVar2 = (int *)calloc(__nmemb,4);
  pGVar1->pUniques = piVar2;
  pwVar3 = (word *)calloc(__nmemb,8);
  pGVar1->pStoreW = pwVar3;
  iVar6 = iVar5 + 3;
  if (-1 < (long)__nmemb) {
    iVar6 = iVar5;
  }
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < (iVar6 >> 2) - 1U) {
    iVar5 = iVar6 >> 2;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar5;
  if (iVar5 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar5 * 4);
  }
  pVVar4->pArray = piVar2;
  pGVar1->vClasses = pVVar4;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar5;
  if (iVar5 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar5 << 2);
  }
  pVVar4->pArray = piVar2;
  pGVar1->vClasses2 = pVVar4;
  return pGVar1;
}

Assistant:

Gia_IsoMan_t * Gia_IsoManStart( Gia_Man_t * pGia )
{
    Gia_IsoMan_t * p;
    p = ABC_CALLOC( Gia_IsoMan_t, 1 );
    p->pGia      = pGia;
    p->nObjs     = Gia_ManObjNum( pGia );
    p->nUniques  = 1;
    p->nEntries  = p->nObjs;
    // internal data
    p->pLevels   = ABC_CALLOC( int, p->nObjs );
    p->pUniques  = ABC_CALLOC( int, p->nObjs );
    p->pStoreW   = ABC_CALLOC( word, p->nObjs );
    // class representation
    p->vClasses  = Vec_IntAlloc( p->nObjs/4 );
    p->vClasses2 = Vec_IntAlloc( p->nObjs/4 );
    return p;
}